

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_action.cpp
# Opt level: O0

int AF_AActor_A_NoBlocking
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  int iVar1;
  AActor *self_00;
  VMValue *pVVar2;
  bool bVar3;
  bool local_3c;
  bool local_39;
  bool drop;
  AActor *self;
  int paramnum;
  int numret_local;
  VMReturn *ret_local;
  int numparam_local;
  TArray<VMValue,_VMValue> *defaultparam_local;
  VMValue *param_local;
  
  if (numparam < 1) {
    __assert_fail("(paramnum) < numparam",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x47,
                  "int AF_AActor_A_NoBlocking(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  bVar3 = false;
  if (((param->field_0).field_3.Type == '\x03') &&
     (bVar3 = true, (param->field_0).field_1.atag != 1)) {
    bVar3 = (param->field_0).field_1.a == (void *)0x0;
  }
  if (bVar3) {
    self_00 = (AActor *)(param->field_0).field_1.a;
    local_3c = true;
    if (self_00 != (AActor *)0x0) {
      local_3c = DObject::IsKindOf((DObject *)self_00,AActor::RegistrationInfo.MyClass);
    }
    if (local_3c != false) {
      if (numparam < 2) {
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        if ((pVVar2->field_0).field_3.Type != '\0') {
          __assert_fail("(defaultparam[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                        ,0x48,
                        "int AF_AActor_A_NoBlocking(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pVVar2 = TArray<VMValue,_VMValue>::operator[](defaultparam,1);
        iVar1 = (pVVar2->field_0).i;
      }
      else {
        if (param[1].field_0.field_3.Type != '\0') {
          __assert_fail("(param[paramnum]).Type == REGT_INT",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                        ,0x48,
                        "int AF_AActor_A_NoBlocking(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        iVar1 = param[1].field_0.i;
      }
      local_39 = iVar1 != 0;
      A_Unblock(self_00,local_39);
      return 0;
    }
    __assert_fail("self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                  ,0x47,
                  "int AF_AActor_A_NoBlocking(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
  }
  __assert_fail("param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
                ,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/g_shared/a_action.cpp"
                ,0x47,
                "int AF_AActor_A_NoBlocking(VMValue *, TArray<VMValue> &, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_NoBlocking)
{
	PARAM_SELF_PROLOGUE(AActor);
	PARAM_BOOL_DEF(drop);
	A_Unblock(self, drop);
	return 0;
}